

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittests.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_30c12::HashListTest::compareList
          (HashListTest *this,ktxHashList list,bool isSorted)

{
  bool bVar1;
  int iVar2;
  byte in_DL;
  long in_RSI;
  long in_RDI;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  ktx_uint32_t valueLen;
  ktx_uint32_t keyLen;
  ktx_uint8_t *value;
  char *key;
  ktx_uint32_t entryCount;
  ktxHashListEntry *entry;
  bool *in_stack_fffffffffffffe78;
  AssertionResult *in_stack_fffffffffffffe80;
  uint *in_stack_fffffffffffffe88;
  char *in_stack_fffffffffffffe90;
  char *in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffea0;
  int in_stack_fffffffffffffea4;
  Type type;
  AssertHelper *in_stack_fffffffffffffeb0;
  AssertionResult local_138;
  string local_128 [8];
  char *in_stack_fffffffffffffee0;
  char *in_stack_fffffffffffffee8;
  char *in_stack_fffffffffffffef0;
  AssertionResult *in_stack_fffffffffffffef8;
  AssertHelper *in_stack_ffffffffffffff00;
  AssertionResult local_f0 [2];
  undefined4 local_d0;
  undefined4 local_cc;
  AssertionResult local_c8 [2];
  undefined4 local_a8;
  undefined4 local_a4;
  AssertionResult local_a0 [2];
  AssertionResult local_80 [3];
  AssertionResult local_50;
  undefined1 local_40 [4];
  undefined1 local_3c [4];
  undefined1 local_38 [8];
  char *local_30;
  int local_24;
  long local_20;
  byte local_11;
  
  local_11 = in_DL & 1;
  local_24 = 0;
  for (local_20 = in_RSI; local_20 != 0; local_20 = ktxHashList_Next(local_20)) {
    local_24 = local_24 + 1;
    ktxHashListEntry_GetKey(local_20,local_3c,&local_30);
    ktxHashListEntry_GetValue(local_20,local_40,local_38);
    if ((local_11 & 1) != 0) {
      in_stack_fffffffffffffea4 = local_24;
      if (local_24 == 1) {
        testing::internal::CmpHelperSTREQ
                  (&in_stack_fffffffffffffef8->success_,in_stack_fffffffffffffef0,
                   in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_50);
        if (!bVar1) {
          testing::Message::Message((Message *)in_stack_fffffffffffffeb0);
          in_stack_fffffffffffffe98 =
               testing::AssertionResult::failure_message((AssertionResult *)0x14fa84);
          testing::internal::AssertHelper::AssertHelper
                    (in_stack_fffffffffffffeb0,(Type)((ulong)in_RDI >> 0x20),
                     (char *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                     (int)((ulong)in_stack_fffffffffffffe98 >> 0x20),in_stack_fffffffffffffe90);
          testing::internal::AssertHelper::operator=
                    (in_stack_ffffffffffffff00,(Message *)in_stack_fffffffffffffef8);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe80);
          testing::Message::~Message((Message *)0x14fae1);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x14fb4c);
      }
      else if (local_24 == 2) {
        testing::internal::CmpHelperSTREQ
                  (&in_stack_fffffffffffffef8->success_,in_stack_fffffffffffffef0,
                   in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(local_80);
        if (!bVar1) {
          testing::Message::Message((Message *)in_stack_fffffffffffffeb0);
          in_stack_fffffffffffffe90 =
               testing::AssertionResult::failure_message((AssertionResult *)0x14fbc1);
          testing::internal::AssertHelper::AssertHelper
                    (in_stack_fffffffffffffeb0,(Type)((ulong)in_RDI >> 0x20),
                     (char *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                     (int)((ulong)in_stack_fffffffffffffe98 >> 0x20),in_stack_fffffffffffffe90);
          testing::internal::AssertHelper::operator=
                    (in_stack_ffffffffffffff00,(Message *)in_stack_fffffffffffffef8);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe80);
          testing::Message::~Message((Message *)0x14fc1e);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x14fc89);
      }
    }
    iVar2 = strcmp(local_30,"KTXorientation");
    if (iVar2 == 0) {
      local_a4 = std::__cxx11::string::compare((char *)(in_RDI + 0x38));
      local_a8 = 0;
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                (in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
                 (int *)in_stack_fffffffffffffe88,(int *)in_stack_fffffffffffffe80);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_a0);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffeb0);
        in_stack_fffffffffffffe88 =
             (uint *)testing::AssertionResult::failure_message((AssertionResult *)0x14fd45);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffeb0,(Type)((ulong)in_RDI >> 0x20),
                   (char *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                   (int)((ulong)in_stack_fffffffffffffe98 >> 0x20),in_stack_fffffffffffffe90);
        testing::internal::AssertHelper::operator=
                  (in_stack_ffffffffffffff00,(Message *)in_stack_fffffffffffffef8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe80);
        testing::Message::~Message((Message *)0x14fda2);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x14fe0d);
    }
    else {
      iVar2 = strcmp(local_30,"KTXwriter");
      if (iVar2 == 0) {
        local_cc = std::__cxx11::string::compare((char *)(in_RDI + 0x18));
        local_d0 = 0;
        testing::internal::EqHelper::Compare<int,_int,_nullptr>
                  (in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
                   (int *)in_stack_fffffffffffffe88,(int *)in_stack_fffffffffffffe80);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(local_c8);
        if (!bVar1) {
          testing::Message::Message((Message *)in_stack_fffffffffffffeb0);
          in_stack_fffffffffffffe80 =
               (AssertionResult *)
               testing::AssertionResult::failure_message((AssertionResult *)0x14fec8);
          testing::internal::AssertHelper::AssertHelper
                    (in_stack_fffffffffffffeb0,(Type)((ulong)in_RDI >> 0x20),
                     (char *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                     (int)((ulong)in_stack_fffffffffffffe98 >> 0x20),in_stack_fffffffffffffe90);
          testing::internal::AssertHelper::operator=
                    (in_stack_ffffffffffffff00,(Message *)in_stack_fffffffffffffef8);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe80);
          testing::Message::~Message((Message *)0x14ff25);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x14ff90);
      }
      else {
        testing::AssertionResult::AssertionResult<bool>
                  (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,(type *)0x14ffc8);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(local_f0);
        if (!bVar1) {
          testing::Message::Message((Message *)in_stack_fffffffffffffeb0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                     in_stack_fffffffffffffee0);
          std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (in_stack_fffffffffffffeb0,(Type)((ulong)in_RDI >> 0x20),
                     (char *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                     (int)((ulong)in_stack_fffffffffffffe98 >> 0x20),in_stack_fffffffffffffe90);
          testing::internal::AssertHelper::operator=
                    (in_stack_ffffffffffffff00,(Message *)in_stack_fffffffffffffef8);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe80);
          std::__cxx11::string::~string(local_128);
          testing::Message::~Message((Message *)0x15007c);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x150107);
      }
    }
  }
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
            (in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
             (uint *)in_stack_fffffffffffffe80);
  iVar2 = (int)((ulong)in_stack_fffffffffffffe98 >> 0x20);
  type = (Type)((ulong)in_RDI >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_138);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffeb0);
    testing::AssertionResult::failure_message((AssertionResult *)0x150191);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffeb0,type,
               (char *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),iVar2,
               in_stack_fffffffffffffe90);
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffff00,(Message *)in_stack_fffffffffffffef8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe80);
    testing::Message::~Message((Message *)0x1501dd);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x15023f);
  return;
}

Assistant:

void compareList(ktxHashList list, bool isSorted) {
        ktxHashListEntry* entry = list;
        ktx_uint32_t entryCount = 0;

        for (; entry != NULL; entry = ktxHashList_Next(entry)) {
            char* key;
            ktx_uint8_t* value;
            ktx_uint32_t keyLen, valueLen;

            entryCount++;
            ktxHashListEntry_GetKey(entry, &keyLen, &key);
            ktxHashListEntry_GetValue(entry, &valueLen, (void**)&value);
            if (isSorted) {
                switch (entryCount) {
                  case 1:
                    EXPECT_STREQ(key, KTX_ORIENTATION_KEY);
                    break;
                  case 2:
                    EXPECT_STREQ(key, KTX_WRITER_KEY);
                    break;
                  default:
                    break;
                }
            }
            if (strcmp(key, KTX_ORIENTATION_KEY) == 0)
                EXPECT_EQ(orientationVal.compare((char*)value), 0);
            else if (strcmp(key, KTX_WRITER_KEY) == 0)
                EXPECT_EQ(writerVal.compare((char*)value), 0);
            else
                EXPECT_TRUE(false);
        }
        EXPECT_EQ(entryCount, 2U);
    }